

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_scanner.hpp
# Opt level: O0

void __thiscall MC::MC_Scanner::MC_Scanner(MC_Scanner *this,istream *in)

{
  location *this_00;
  position local_38 [2];
  istream *local_18;
  istream *in_local;
  MC_Scanner *this_local;
  
  local_18 = in;
  in_local = (istream *)this;
  yyFlexLexer::yyFlexLexer(&this->super_yyFlexLexer,in,(ostream *)0x0);
  (this->super_yyFlexLexer).super_FlexLexer._vptr_FlexLexer =
       (_func_int **)&PTR__MC_Scanner_001be2a8;
  this->yylval = (semantic_type *)0x0;
  this->loc = (location_type *)0x0;
  this_00 = (location *)operator_new(0x20);
  position::position(local_38,(filename_type *)0x0,1,1);
  location::location(this_00,local_38);
  this->loc = this_00;
  return;
}

Assistant:

MC_Scanner(std::istream *in) : yyFlexLexer(in)
   {
      loc = new MC::MC_Parser::location_type();
   }